

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionSystemBullet::GetBoundingBox
          (ChCollisionSystemBullet *this,ChVector<double> *aabb_min,ChVector<double> *aabb_max)

{
  cbtVector3 aabbMax;
  cbtVector3 aabbMin;
  float local_40;
  float local_3c;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  
  (*this->bt_broadphase->_vptr_cbtBroadphaseInterface[0xb])(this->bt_broadphase,&local_30,&local_40)
  ;
  aabb_min->m_data[0] = (double)local_30;
  aabb_min->m_data[1] = (double)local_2c;
  aabb_min->m_data[2] = (double)local_28;
  aabb_max->m_data[0] = (double)local_40;
  aabb_max->m_data[1] = (double)local_3c;
  aabb_max->m_data[2] = (double)local_38;
  return;
}

Assistant:

void ChCollisionSystemBullet::GetBoundingBox(ChVector<>& aabb_min, ChVector<>& aabb_max) const {
    cbtVector3 aabbMin;
    cbtVector3 aabbMax;
    bt_broadphase->getBroadphaseAabb(aabbMin, aabbMax);
    aabb_min = ChVector<>((double)aabbMin.x(), (double)aabbMin.y(), (double)aabbMin.z());
    aabb_max = ChVector<>((double)aabbMax.x(), (double)aabbMax.y(), (double)aabbMax.z());
}